

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall UtilTest_SystemError_Test::TestBody(UtilTest_SystemError_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *pcVar1;
  string_view message;
  AssertionResult gtest_ar;
  string local_68;
  AssertionResult gtest_ar_1;
  system_error e;
  char *local_10;
  
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  message.size_ = 4;
  message.data_ = "test";
  fmt::v5::system_error::system_error<>(&e,0x21,message);
  get_system_error_abi_cxx11_(&local_68,0x21);
  fmt::v5::format<char[9],std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1,
             (v5 *)"test: {}",(char (*) [9])&local_68,args);
  local_10 = (char *)std::runtime_error::what();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
            ((internal *)&gtest_ar,"fmt::format(\"test: {}\", get_system_error(33))","e.what()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_1,
             &local_10);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x20f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_68._M_dataplus._M_p._0_4_ = 0x21;
  gtest_ar._0_4_ = e.error_code_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"33","e.error_code()",(int *)&local_68,(int *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x210,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  check_throw_error<fmt::v5::system_error>(0x21,fmt::v5::format_system_error);
  std::runtime_error::~runtime_error(&e.super_runtime_error);
  return;
}

Assistant:

TEST(UtilTest, SystemError) {
  fmt::system_error e(EDOM, "test");
  EXPECT_EQ(fmt::format("test: {}", get_system_error(EDOM)), e.what());
  EXPECT_EQ(EDOM, e.error_code());
  check_throw_error<fmt::system_error>(EDOM, fmt::format_system_error);
}